

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zesFabricPortGetProperties
          (zes_fabric_port_handle_t hPort,zes_fabric_port_properties_t *pProperties)

{
  zes_pfnFabricPortGetProperties_t pfnGetProperties;
  dditable_t *dditable;
  ze_result_t result;
  zes_fabric_port_properties_t *pProperties_local;
  zes_fabric_port_handle_t hPort_local;
  
  if (*(code **)(*(long *)(hPort + 8) + 0xbd8) == (code *)0x0) {
    hPort_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hPort_local._4_4_ =
         (**(code **)(*(long *)(hPort + 8) + 0xbd8))(*(undefined8 *)hPort,pProperties);
  }
  return hPort_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFabricPortGetProperties(
        zes_fabric_port_handle_t hPort,                 ///< [in] Handle for the component.
        zes_fabric_port_properties_t* pProperties       ///< [in,out] Will contain properties of the Fabric Port.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_fabric_port_object_t*>( hPort )->dditable;
        auto pfnGetProperties = dditable->zes.FabricPort.pfnGetProperties;
        if( nullptr == pfnGetProperties )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hPort = reinterpret_cast<zes_fabric_port_object_t*>( hPort )->handle;

        // forward to device-driver
        result = pfnGetProperties( hPort, pProperties );

        return result;
    }